

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int fio_defer(_func_void_void_ptr_void_ptr *func,void *arg1,void *arg2)

{
  fio_defer_task_s task;
  
  if (func != (_func_void_void_ptr_void_ptr *)0x0) {
    task.arg1 = arg1;
    task.func = func;
    task.arg2 = arg2;
    fio_defer_push_task_fn(task,&task_queue_normal);
    return 0;
  }
  return -1;
}

Assistant:

int fio_defer(void (*func)(void *, void *), void *arg1, void *arg2) {
  /* must have a task to defer */
  if (!func)
    goto call_error;
  fio_defer_push_task(func, arg1, arg2);
  return 0;

call_error:
  return -1;
}